

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void do_test_pre_shared_key(int mode)

{
  size_t consumed;
  size_t client_max_early_data_size;
  ptls_handshake_properties_t client_prop;
  ptls_key_exchange_algorithm_t *alternate_keyex [3];
  ptls_context_t ctx_server;
  undefined8 local_370 [5];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [664];
  
  memcpy(local_2c8,ctx,0x140);
  local_328 = local_370;
  local_370[0] = 0;
  uStack_320 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_348 = 0;
  uStack_340 = 0;
  (*(code *)(&DAT_0013a184 + *(int *)(&DAT_0013a184 + (ulong)(mode + 1) * 4)))();
  return;
}

Assistant:

static void do_test_pre_shared_key(int mode)
{
    ptls_context_t ctx_client = *ctx;
    ptls_key_exchange_algorithm_t *alternate_keyex[3];
    size_t client_max_early_data_size = 0;
    ptls_handshake_properties_t client_prop = {.client.max_early_data_size = &client_max_early_data_size};

    switch (mode) {
    case 0: /* no keyex */
        ctx_client.key_exchanges = NULL;
        break;
    case 1: /* keyex match */
        break;
    case 2: /* server has no keyex */
        break;
    case 3: /* keyex mismatch */
        if (!(ctx_client.key_exchanges[0] != NULL && ctx_client.key_exchanges[1] != NULL)) {
            note("keyex mismatch test requires two key exchange algorithms");
            return;
        }
        alternate_keyex[0] = ctx_client.key_exchanges[1];
        alternate_keyex[1] = ctx_client.key_exchanges[0];
        alternate_keyex[2] = NULL;
        ctx_client.key_exchanges = alternate_keyex;
        break;
    case 4: /* negotiate */
        client_prop.client.negotiate_before_key_exchange = 1;
        break;
    case -1: /* fail:requires-psk-dhe */
        ctx_client.key_exchanges = NULL;
        break;
    default:
        assert(!"FIXME");
    }

    ctx_client.max_early_data_size = 16384;
    assert(ctx_client.pre_shared_key.identity.len == 0 && ctx_client.pre_shared_key.secret.len == 0);
    ctx_client.pre_shared_key.identity = ptls_iovec_init("", 1);
    ctx_client.pre_shared_key.secret = ptls_iovec_init("hello world", 11);
    for (size_t i = 0; ctx_client.cipher_suites[i] != NULL; ++i) {
        if (strcmp(ctx_client.cipher_suites[i]->hash->name, "sha256") == 0) {
            ctx_client.pre_shared_key.hash = ctx_client.cipher_suites[i]->hash;
            break;
        }
    }
    assert(ctx_client.pre_shared_key.hash != NULL);

    ptls_context_t ctx_server = ctx_client;
    switch (mode) {
    case 2: /* server has no keyex */
        ctx_server.key_exchanges = NULL;
        break;
    case -1: /* fail:requires-psk-dhe */
        ctx_server.require_dhe_on_psk = 1;
        break;
    default:
        break;
    }

    ptls_t *client = ptls_new(&ctx_client, 0), *server = ptls_new(&ctx_server, 1);
    ptls_buffer_t cbuf, sbuf, decbuf;
    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);
    ptls_buffer_init(&decbuf, "", 0);

    /* [client] send CH and early data */
    int ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_prop.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
    ok(client_max_early_data_size == SIZE_MAX);
    ret = ptls_send(client, &cbuf, "hello", 5);
    ok(ret == 0);

    /* [server] read CH and generate up to ServerFinished */
    size_t consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    if (mode < 0) {
        ok(ret == PTLS_ALERT_HANDSHAKE_FAILURE);
        goto Exit;
    }
    ok(consumed <= cbuf.off);
    memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
    cbuf.off -= consumed;
    if (mode >= 3) {
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(cbuf.off == 0);
        consumed = sbuf.off;
        ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_prop);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(client_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
        ok(consumed == sbuf.off);
        sbuf.off = 0;
        consumed = cbuf.off;
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    } else {
        ok(ret == 0);
        /* [server] read early data */
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        cbuf.off = 0;
        ok(decbuf.off == 5);
        ok(memcmp(decbuf.base, "hello", 5) == 0);
        decbuf.off = 0;
    }

    /* [server] write 0.5-RTT data */
    ret = ptls_send(server, &sbuf, "hi", 2);
    ok(ret == 0);

    /* [client] read up to ServerFinished */
    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_prop);
    ok(ret == 0);
    ok(client_prop.client.early_data_acceptance == (mode < 3 ? PTLS_EARLY_DATA_ACCEPTED : PTLS_EARLY_DATA_REJECTED));
    ok(consumed < sbuf.off);
    memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
    sbuf.off -= consumed;

    /* [client] read 0.5-RTT data */
    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    sbuf.off = 0;
    ok(decbuf.off == 2);
    ok(memcmp(decbuf.base, "hi", 2) == 0);
    decbuf.off = 0;

    /* [client] write 1-RTT data */
    ret = ptls_send(client, &cbuf, "bye", 3);
    ok(ret == 0);

    /* [server] read ClientFinished and 1-RTT data */
    ok(!ptls_handshake_is_complete(server));
    consumed = cbuf.off;
    ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));
    ok(consumed == cbuf.off);
    cbuf.off = 0;
    ok(decbuf.off == 3);
    ok(memcmp(decbuf.base, "bye", 3) == 0);

Exit:
    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);
}